

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O3

bean_ptr<Person> * __thiscall
hiberlite::Database::copyBean<Person>
          (bean_ptr<Person> *__return_storage_ptr__,Database *this,Person *c)

{
  pointer pcVar1;
  Person *ptr;
  
  ptr = (Person *)operator_new(0x40);
  (ptr->name)._M_dataplus._M_p = (pointer)&(ptr->name).field_2;
  pcVar1 = (c->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)ptr,pcVar1,pcVar1 + (c->name)._M_string_length);
  ptr->age = c->age;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&ptr->bio,&c->bio);
  manageBean<Person>(__return_storage_ptr__,this,ptr);
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Database::copyBean(const C& c)
{
	return manageBean<C>( new C(c) );
}